

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::copyStreamData(QPDF *this,QPDFObjectHandle *result,QPDFObjectHandle *foreign)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  CopiedStreamDataProvider *pCVar2;
  QPDF *pQVar3;
  logic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  allocator<char> local_159;
  shared_ptr<QPDF::ForeignStreamData> foreign_stream_data;
  allocator<char> local_141;
  QPDFObjectHandle local_140;
  string local_130;
  QPDFObjectHandle local_110 [2];
  Stream stream;
  QPDFObjectHandle dict;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider;
  QPDFObjectHandle local_c0;
  shared_ptr<Buffer> stream_buffer;
  QPDFObjGen local_og;
  QPDFObjectHandle old_dict;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_68;
  QPDFObjectHandle local_58;
  __shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  QPDFObjectHandle::getDict(&dict);
  QPDFObjectHandle::getDict(&old_dict);
  if (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_stream_data_provider ==
      (CopiedStreamDataProvider *)0x0) {
    pCVar2 = (CopiedStreamDataProvider *)operator_new(0x78);
    CopiedStreamDataProvider::CopiedStreamDataProvider(pCVar2,this);
    ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_stream_data_provider =
         pCVar2;
    std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<QPDF::CopiedStreamDataProvider,void>
              ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)
               &local_130,
               ((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
               copied_stream_data_provider);
    std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_streams).
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> *)
                &local_130);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
  }
  local_og = QPDFObjectHandle::getObjGen(result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"unable to retrieve owning qpdf from foreign stream",
             (allocator<char> *)local_110);
  pQVar3 = QPDFObjectHandle::getQPDF(foreign,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  QPDFObjectHandle::as_stream((QPDFObjectHandle *)&stream,(typed)foreign);
  if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    ::qpdf::Stream::getStreamDataBuffer((Stream *)&stream_buffer);
    if ((((pQVar3->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
          ._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
          super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->immediate_copy_from == true)
       && (stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0)) {
      QPDFObjectHandle::getRawStreamData(&local_58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"/Filter",(allocator<char> *)&local_140);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&stream_provider,(string *)&old_dict);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,"/DecodeParms",(allocator<char> *)&local_c0);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&old_dict);
      QPDFObjectHandle::replaceStreamData
                (foreign,(shared_ptr<Buffer> *)&local_58,(QPDFObjectHandle *)&stream_provider,
                 (QPDFObjectHandle *)&foreign_stream_data);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&foreign_stream_data.
                  super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)local_110);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&stream_provider.
                  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ::qpdf::Stream::getStreamDataBuffer((Stream *)&local_130);
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
    }
    ::qpdf::Stream::getStreamDataProvider((Stream *)&stream_provider);
    if (stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (stream_provider.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        _Var1._M_head_impl =
             (pQVar3->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        local_130._M_dataplus._M_p = (pointer)QPDFObjectHandle::getParsedOffset(foreign);
        local_110[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)::qpdf::Stream::getLength(&stream);
        local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr._0_1_ = (allocator<char>)::qpdf::Stream::isRootMetadata(&stream);
        std::
        make_shared<QPDF::ForeignStreamData,std::shared_ptr<QPDF::EncryptionParameters>&,std::shared_ptr<InputSource>&,QPDFObjectHandle&,long_long,unsigned_long,QPDFObjectHandle&,bool>
                  ((shared_ptr<QPDF::EncryptionParameters> *)&foreign_stream_data,
                   (shared_ptr<InputSource> *)&(_Var1._M_head_impl)->encp,
                   (QPDFObjectHandle *)&(_Var1._M_head_impl)->file,(longlong *)foreign,
                   (unsigned_long *)&local_130,local_110,(bool *)&dict);
        pCVar2 = ((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                 copied_stream_data_provider;
        std::__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,
                   &foreign_stream_data.
                    super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>);
        CopiedStreamDataProvider::registerForeignStream
                  (pCVar2,&local_og,(shared_ptr<QPDF::ForeignStreamData> *)&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_88,
                     &(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_streams
                      ).
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                    );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"/Filter",&local_159);
        QPDFObjectHandle::getKey(&local_140,(string *)&dict);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_110,"/DecodeParms",&local_141);
        QPDFObjectHandle::getKey(&local_c0,(string *)&dict);
        QPDFObjectHandle::replaceStreamData
                  (result,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_88,&local_140,
                   &local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)local_110);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_140.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
        this_01 = &foreign_stream_data.
                   super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        pCVar2 = ((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                 copied_stream_data_provider;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)foreign);
        CopiedStreamDataProvider::registerForeignStream
                  (pCVar2,&local_og,(QPDFObjectHandle *)&local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
        std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_78,
                     &(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->copied_streams
                      ).
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                    );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"/Filter",(allocator<char> *)&local_c0);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&dict);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_110,"/DecodeParms",&local_159);
        QPDFObjectHandle::getKey(&local_140,(string *)&dict);
        QPDFObjectHandle::replaceStreamData
                  (result,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_78,
                   (QPDFObjectHandle *)&foreign_stream_data,&local_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_140.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)local_110);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&foreign_stream_data.
                    super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_130);
        this_01 = &local_78._M_refcount;
      }
    }
    else {
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,&stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"/Filter",(allocator<char> *)&local_c0);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&foreign_stream_data,(string *)&dict);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,"/DecodeParms",&local_159);
      QPDFObjectHandle::getKey(&local_140,(string *)&dict);
      QPDFObjectHandle::replaceStreamData
                (result,(shared_ptr<Buffer> *)&local_68,(QPDFObjectHandle *)&foreign_stream_data,
                 &local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_140.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_110);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&foreign_stream_data.
                  super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&local_130);
      this_01 = &local_68._M_refcount;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream_provider.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream_buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&old_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"unable to retrieve underlying stream object from foreign stream");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::copyStreamData(QPDFObjectHandle result, QPDFObjectHandle foreign)
{
    // This method was originally written for copying foreign streams, but it is used by
    // QPDFObjectHandle to copy streams from the same QPDF object as well.

    QPDFObjectHandle dict = result.getDict();
    QPDFObjectHandle old_dict = foreign.getDict();
    if (m->copied_stream_data_provider == nullptr) {
        m->copied_stream_data_provider = new CopiedStreamDataProvider(*this);
        m->copied_streams =
            std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(m->copied_stream_data_provider);
    }
    QPDFObjGen local_og(result.getObjGen());
    // Copy information from the foreign stream so we can pipe its data later without keeping the
    // original QPDF object around.

    QPDF& foreign_stream_qpdf =
        foreign.getQPDF("unable to retrieve owning qpdf from foreign stream");

    auto stream = foreign.as_stream();
    if (!stream) {
        throw std::logic_error("unable to retrieve underlying stream object from foreign stream");
    }
    std::shared_ptr<Buffer> stream_buffer = stream.getStreamDataBuffer();
    if ((foreign_stream_qpdf.m->immediate_copy_from) && (stream_buffer == nullptr)) {
        // Pull the stream data into a buffer before attempting the copy operation. Do it on the
        // source stream so that if the source stream is copied multiple times, we don't have to
        // keep duplicating the memory.
        QTC::TC("qpdf", "QPDF immediate copy stream data");
        foreign.replaceStreamData(
            foreign.getRawStreamData(),
            old_dict.getKey("/Filter"),
            old_dict.getKey("/DecodeParms"));
        stream_buffer = stream.getStreamDataBuffer();
    }
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> stream_provider =
        stream.getStreamDataProvider();
    if (stream_buffer.get()) {
        QTC::TC("qpdf", "QPDF copy foreign stream with buffer");
        result.replaceStreamData(
            stream_buffer, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else if (stream_provider.get()) {
        // In this case, the remote stream's QPDF must stay in scope.
        QTC::TC("qpdf", "QPDF copy foreign stream with provider");
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    } else {
        auto foreign_stream_data = std::make_shared<ForeignStreamData>(
            foreign_stream_qpdf.m->encp,
            foreign_stream_qpdf.m->file,
            foreign,
            foreign.getParsedOffset(),
            stream.getLength(),
            dict,
            stream.isRootMetadata());
        m->copied_stream_data_provider->registerForeignStream(local_og, foreign_stream_data);
        result.replaceStreamData(
            m->copied_streams, dict.getKey("/Filter"), dict.getKey("/DecodeParms"));
    }
}